

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

void Centaurus::DFARoutineEM64T<char>::emit_state
               (X86Assembler *as,Label *rejectlabel,DFAState<char> *state,int index,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels,MyConstPool *pool)

{
  byte bVar1;
  pointer pRVar2;
  const_iterator __position;
  iterator __begin0;
  pointer pNVar3;
  uint uVar4;
  Range<char> *r;
  pointer pRVar5;
  uint32_t instId;
  uint o1;
  anon_union_16_7_ed616b9d_for_Operand__0 local_a0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  transitions;
  Label looplabel;
  anon_union_16_7_ed616b9d_for_Operand__0 local_48;
  
  std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
  vector(&transitions,&(state->super_NFABaseState<char,_Centaurus::IndexVector>).m_transitions);
  __position._M_current =
       transitions.
       super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while (__position._M_current !=
         transitions.
         super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    if (((__position._M_current)->m_dest == index) && (state->m_long == true)) {
      local_48._packed[0] = (UInt64)0x210000149;
      local_48._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0;
      MyConstPool::load_charclass_filter<char>
                (pool,(X86Xmm *)&local_48._any,&(__position._M_current)->m_label);
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&looplabel,as);
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,&looplabel);
      local_a0._packed[0] = (UInt64)0x32;
      local_a0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x600000000;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x191,(Operand_ *)(asmjit::x86OpData + 0x700),
                 (Operand_ *)&local_a0._any);
      local_a0._packed[0].i64 = (UInt64)0x3;
      local_a0._mem.field_2.offset64 = (anon_union_8_2_78723da6_for_MemData_2)0x14;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x1e1,(Operand_ *)(asmjit::x86OpData + 0x720),
                 (Operand_ *)(asmjit::x86OpData + 0x700),(Operand_ *)&local_a0._any);
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,7,(Operand_ *)(asmjit::x86OpData + 0x4e0),
                 (Operand_ *)(asmjit::x86OpData + 0x490));
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x490),0xf);
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11a,(Operand_ *)&looplabel);
      __position._M_current =
           (NFATransition<char> *)
           std::
           vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ::erase(&transitions,__position);
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  if (state->m_accept != false) {
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4b0),
               (Operand_ *)(asmjit::x86OpData + 0x4e0));
    __position._M_current =
         transitions.
         super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (transitions.
      super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != __position._M_current) {
    looplabel.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)8.28907076174039e-317;
    looplabel.super_Operand.super_Operand_.field_0._any.reserved12_4 = 6;
    looplabel.super_Operand.super_Operand_.field_0._any.reserved8_4 = 0;
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)as,0x1ad,(Operand_ *)(asmjit::x86OpData + 0x480),
               (Operand_ *)&looplabel);
    asmjit::CodeEmitter::emit
              ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x490),
               (Operand_ *)(asmjit::x86OpData + 0x480));
    asmjit::CodeEmitter::emit((CodeEmitter *)as,0x105,(Operand_ *)(asmjit::x86OpData + 0x4e0));
    pNVar3 = transitions.
             super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)transitions.
              super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)transitions.
              super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x38) {
      pRVar5 = ((transitions.
                 super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_label).m_ranges.
               super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pRVar2 = ((transitions.
                 super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_label).m_ranges.
               super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (((long)pRVar5 - (long)pRVar2 & 0xffffffff0U) == 0x10) {
        if (pRVar5 == pRVar2) {
          uVar4 = 0;
          o1 = 0;
LAB_00124398:
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x2c4,(Operand_ *)(asmjit::x86OpData + 0x480),o1);
          instId = 0x121;
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),uVar4 - o1);
        }
        else {
          o1 = (uint)(byte)pRVar2->m_start;
          uVar4 = (uint)(byte)pRVar2->m_end;
          if ((byte)pRVar2->m_start + 1 != (uint)(byte)pRVar2->m_end) goto LAB_00124398;
          instId = 0x124;
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),o1);
        }
        asmjit::CodeEmitter::emit((CodeEmitter *)as,instId,(Operand_ *)rejectlabel);
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x11e,
                   (Operand_ *)
                   ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                    _M_impl.super__Vector_impl_data._M_start +
                   (transitions.
                    super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_dest));
        goto LAB_00124376;
      }
    }
    for (; pNVar3 != transitions.
                     super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pNVar3 = pNVar3 + 1) {
      pRVar2 = (pNVar3->m_label).m_ranges.
               super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pRVar5 = (pNVar3->m_label).m_ranges.
                    super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pRVar5 != pRVar2; pRVar5 = pRVar5 + 1
          ) {
        bVar1 = pRVar5->m_start;
        if (bVar1 + 1 == (uint)(byte)pRVar5->m_end) {
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),(uint)bVar1);
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x118,
                     (Operand_ *)
                     ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                      _M_impl.super__Vector_impl_data._M_start + pNVar3->m_dest));
        }
        else {
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x2c4,(Operand_ *)(asmjit::x86OpData + 0x480),(uint)bVar1);
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
                     (uint)(byte)pRVar5->m_end - (uint)(byte)pRVar5->m_start);
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x115,
                     (Operand_ *)
                     ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                      _M_impl.super__Vector_impl_data._M_start + pNVar3->m_dest));
          asmjit::CodeEmitter::emit
                    ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x480),
                     (Operand_ *)(asmjit::x86OpData + 0x490));
        }
      }
    }
  }
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11e,(Operand_ *)rejectlabel);
LAB_00124376:
  std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
  ~vector(&transitions);
  return;
}

Assistant:

void DFARoutineEM64T<TCHAR>::emit_state(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const DFAState<TCHAR>& state, int index, std::vector<asmjit::Label>& labels, MyConstPool& pool)
{
    std::vector<NFATransition<TCHAR> > transitions(state.get_transitions());

    for (auto i = transitions.begin(); i != transitions.end();)
    {
        if (i->dest() == index && state.is_long())
        {
            pool.load_charclass_filter(PATTERN2_REG, i->label());

            asmjit::Label looplabel = as.newLabel();

            as.bind(looplabel);

            as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
            as.pcmpistri(PATTERN2_REG, LOAD_REG, asmjit::Imm(sizeof(TCHAR) == 1 ? 0x14 : 0x15));
            if (sizeof(TCHAR) == 2)
                as.sal(INDEX_REG, 1);
            as.add(INPUT_REG, INDEX_REG);
            as.cmp(INDEX_REG, 15);
            as.jg(looplabel);
            i = transitions.erase(i);
        }
        else
        {
            i++;
        }
    }

    if (state.is_accept_state())
        as.mov(BACKUP_REG, INPUT_REG);

    if (transitions.empty())
    {
        as.jmp(rejectlabel);
        return;
    }

    //Read the character from stream and advance the input position
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
    as.mov(CHAR2_REG, CHAR_REG);
    if (sizeof(TCHAR) == 1)
        as.inc(INPUT_REG);
    else
        as.add(INPUT_REG, 2);

    if (transitions.size() == 1)
    {
        const NFATransition<TCHAR>& tr = transitions[0];

        if (tr.label().size() == 1)
        {
            const Range<TCHAR>& r = tr.label()[0];
            {
                if (r.start() + 1 == r.end())
                {
                    as.cmp(CHAR_REG, r.start());
                    as.jne(rejectlabel);
                }
                else
                {
                    as.sub(CHAR_REG, r.start());
                    as.cmp(CHAR_REG, r.end() - r.start());
                    as.jnb(rejectlabel);
                }
            }
            as.jmp(labels[tr.dest()]);

            return;
        }
    }
    for (const auto& tr : transitions)
    {
        for (const auto& r : tr.label())
        {
            if (r.start() + 1 == r.end())
            {
                //The range consists of one character: test for equality and jump
                as.cmp(CHAR_REG, r.start());
                as.je(labels[tr.dest()]);
            }
            else
            {
                //The range consists of multiple characters: range check and jump
                as.sub(CHAR_REG, r.start());
                as.cmp(CHAR_REG, r.end() - r.start());
                as.jb(labels[tr.dest()]);
                as.mov(CHAR_REG, CHAR2_REG);
            }
        }
    }
    //Jump to the "reject trampoline" and check if the input has ever been accepted
    as.jmp(rejectlabel);
}